

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::LookupParameters::squared_l2norm(LookupParameters *this,float *sqnorm)

{
  pointer pTVar1;
  uint uVar2;
  float fVar3;
  RealScalar RVar4;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  fVar3 = 0.0;
  uVar2 = 0;
  while( true ) {
    pTVar1 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48) <=
        (ulong)uVar2) break;
    Tensor::operator*(&local_48,pTVar1 + uVar2);
    RVar4 = Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
            ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)&local_48);
    uVar2 = uVar2 + 1;
    fVar3 = RVar4 + fVar3;
  }
  *sqnorm = fVar3;
  return;
}

Assistant:

void LookupParameters::squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  bool acc = false;
  for (unsigned i = 0; i < values.size(); ++i) {
    gpu::l2_norm_reducer(values[i].d.size(), values[i].v, sqnorm, true, acc);
    acc = true;
  }
#else
  float a = 0;
  for (unsigned i = 0; i < values.size(); ++i)
    a += (*values[i]).squaredNorm();
  *sqnorm = a;
#endif
}